

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-dice.c
# Opt level: O1

_Bool dice_parse_string(dice_t *dice,char *string)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  wchar_t wVar7;
  _Bool _Var13;
  byte *pbVar8;
  dice_expression_entry_t *pdVar10;
  char *pcVar11;
  size_t sVar12;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  char token [17];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 local_58;
  char *local_48;
  ulong local_40;
  ushort **local_38;
  long lVar9;
  
  local_68 = 0;
  uStack_60 = 0;
  local_58 = 0;
  uVar14 = 0;
  if (string != (char *)0x0 && dice != (dice_t *)0x0) {
    dice_reset(dice);
    local_38 = __ctype_b_loc();
    uVar20 = 0;
    uVar17 = 0;
    uVar18 = 0;
    local_48 = string;
    do {
      bVar1 = string[uVar17];
      uVar2 = (*local_38)[(char)bVar1];
      if ((uVar2 >> 0xd & 1) != 0) {
        bVar5 = false;
        goto LAB_001f657d;
      }
      if (bVar1 < 0x4d) {
        switch(bVar1) {
        case 0x24:
          uVar16 = 5;
          break;
        case 0x25:
        case 0x27:
        case 0x28:
        case 0x29:
        case 0x2a:
        case 0x2c:
switchD_001f62b7_caseD_25:
          uVar16 = 6;
          if ((uVar2 >> 0xb & 1) == 0) {
            uVar16 = (ulong)((uint)((uVar2 >> 8 & 1) == 0) * 2 + 7);
          }
          break;
        case 0x26:
          uVar16 = 0;
          break;
        case 0x2b:
          uVar16 = 2;
          break;
        case 0x2d:
          uVar16 = 1;
          break;
        default:
          if (bVar1 != 0) goto switchD_001f62b7_caseD_25;
          uVar16 = 8;
        }
      }
      else {
        if (bVar1 != 0x4d) {
          if (bVar1 == 100) {
            uVar16 = 3;
            goto LAB_001f631f;
          }
          if (bVar1 != 0x6d) goto switchD_001f62b7_caseD_25;
        }
        uVar16 = 4;
      }
LAB_001f631f:
      uVar15 = (uint)uVar16;
      if (uVar15 < 9) {
        if ((0x12dU >> uVar15 & 1) == 0) {
          if ((0xc2U >> uVar15 & 1) == 0) goto LAB_001f637a;
          if (uVar18 < 0x10) {
            *(byte *)((long)&local_68 + uVar18) = bVar1;
            uVar18 = uVar18 + 1;
          }
        }
        if ((((int)uVar20 == 0xd) || (uVar15 == 9)) ||
           ((byte)".B.EHKB....CE..B.C...EHKD.....E..D.......KF..G...H.F.G....H.........KI........I.J................L.G.CEH..LM........."
                  [uVar16 + uVar20 * 9] == 0x2e)) {
          uVar20 = 0xd;
        }
        else {
          uVar20 = (ulong)((byte)".B.EHKB....CE..B.C...EHKD.....E..D.......KF..G...H.F.G....H.........KI........I.J................L.G.CEH..LM........."
                                 [uVar16 + uVar20 * 9] - 0x41);
        }
      }
LAB_001f637a:
      uVar15 = (uint)uVar20;
      if (bVar1 == 0x6d) {
LAB_001f63be:
        if ((uVar15 == 0xd) || ((0x179aUL >> (uVar20 & 0x3f) & 1) != 0)) {
LAB_001f63c4:
          uVar20 = 0xd;
        }
        else {
          pbVar8 = (byte *)(
                           ".B.EHKB....CE..B.C...EHKD.....E..D.......KF..G...H.F.G....H.........KI........I.J................L.G.CEH..LM........."
                           + uVar20 * 9 + 4);
LAB_001f63ec:
          uVar20 = (ulong)(*pbVar8 - 0x41);
        }
      }
      else if (bVar1 == 0x4d) {
        if ((uVar15 & 0xfffffffe) != 10) goto LAB_001f63be;
        if (uVar18 < 0x10) {
          *(undefined1 *)((long)&local_68 + uVar18) = 0x4d;
          uVar18 = uVar18 + 1;
        }
        if ((uVar15 | 0xfffffff4) < 0xfffffffe) goto LAB_001f63c4;
        pbVar8 = (byte *)(
                         ".B.EHKB....CE..B.C...EHKD.....E..D.......KF..G...H.F.G....H.........KI........I.J................L.G.CEH..LM........."
                         + uVar20 * 9 + 7);
        goto LAB_001f63ec;
      }
      bVar5 = true;
      if (0xc < (uint)uVar20) goto LAB_001f657d;
      uVar15 = (uint)uVar14;
      switch((uint)uVar20) {
      case 2:
        uVar14 = 1;
        break;
      default:
        bVar4 = true;
        goto LAB_001f6471;
      case 4:
        uVar14 = 2;
        if ((char)local_68 == '\0') {
          local_68 = CONCAT62(local_68._2_6_,0x31);
        }
        break;
      case 6:
        uVar14 = 3;
        break;
      case 7:
        uVar3 = (uVar15 != 2) + 3;
        goto LAB_001f6462;
      case 9:
        uVar14 = 4;
        break;
      case 0xc:
        uVar3 = uVar15 + 1;
        if (3 < uVar15) {
          uVar3 = 4;
        }
LAB_001f6462:
        uVar14 = (ulong)uVar3;
        bVar4 = false;
        goto LAB_001f6471;
      }
      bVar4 = false;
LAB_001f6471:
      bVar5 = false;
      if ((char)local_68 != '\0' && !bVar4) {
        uVar2 = (*local_38)[(char)local_68];
        local_40 = uVar14;
        if ((uVar2 & 0x100) == 0) {
          lVar9 = strtol((char *)&local_68,(char **)0x0,0);
          iVar6 = (int)lVar9;
        }
        else {
          if (dice->expressions == (dice_expression_entry_t *)0x0) {
            pdVar10 = (dice_expression_entry_t *)mem_zalloc(0x40);
            dice->expressions = pdVar10;
          }
          lVar9 = 0;
          lVar19 = 0;
          do {
            pcVar11 = *(char **)((long)&dice->expressions->name + lVar9);
            if (pcVar11 == (char *)0x0) {
              pcVar11 = string_make((char *)&local_68);
              *(char **)((long)&dice->expressions->name + lVar9) = pcVar11;
              goto LAB_001f6511;
            }
            wVar7 = my_stricmp(pcVar11,(char *)&local_68);
            if (wVar7 == L'\0') goto LAB_001f6511;
            lVar19 = lVar19 + 1;
            lVar9 = lVar9 + 0x10;
          } while (lVar19 != 4);
          lVar19 = 0xffffffff;
LAB_001f6511:
          iVar6 = (int)lVar19;
          string = local_48;
        }
        _Var13 = SUB21((uVar2 & 0x100) >> 8,0);
        switch((int)local_40) {
        case 1:
          dice->b = iVar6;
          dice->ex_b = _Var13;
          break;
        case 2:
          dice->x = iVar6;
          dice->ex_x = _Var13;
          break;
        case 3:
          dice->y = iVar6;
          dice->ex_y = _Var13;
          break;
        case 4:
          dice->m = iVar6;
          dice->ex_m = _Var13;
        }
        local_68 = 0;
        uStack_60 = 0;
        local_58 = 0;
        uVar18 = 0;
        bVar5 = false;
        uVar14 = local_40;
      }
LAB_001f657d:
      if (bVar5) {
        uVar14 = 0;
        goto LAB_001f659e;
      }
      uVar17 = uVar17 + 1;
      sVar12 = strlen(string);
    } while (uVar17 <= sVar12);
    uVar14 = 1;
  }
LAB_001f659e:
  return SUB81(uVar14,0);
}

Assistant:

bool dice_parse_string(dice_t *dice, const char *string)
{
	char token[DICE_TOKEN_SIZE + 1] = { '\0' };
	size_t token_end = 0;
	size_t current = 0;
	dice_state_t state = 0;

	/* We need to keep track of the last thing we saw, since the parser isn't complex. */
	enum last_seen_e {
		DICE_SEEN_NONE,
		DICE_SEEN_BASE,
		DICE_SEEN_DICE,
		DICE_SEEN_SIDE,
		DICE_SEEN_BONUS,
	} last_seen = DICE_SEEN_NONE;

	if (dice == NULL || string == NULL)
		return false;

	/* Reset all internal state, since this object might be reused. */
	dice_reset(dice);

	/* Note that we are including the string terminator as part of the parse. */
	for (current = 0; current <= strlen(string); current++) {
		bool flush;
		dice_input_t input_type = DICE_INPUT_MAX;

		/* Skip spaces; this will concatenate digits and variable names. */
		if (isspace(string[current]))
			continue;

		input_type = dice_input_for_char(string[current]);

		/*
		 * Get the next state, based on the type of input char. If it's a
		 * possible number or varible name, we'll store the character in the
		 * token buffer.
		 */
		switch (input_type) {
			case DICE_INPUT_AMP:
			case DICE_INPUT_BASE:
			case DICE_INPUT_DICE:
			case DICE_INPUT_VAR:
			case DICE_INPUT_NULL:
				state = dice_parse_state_transition(state, input_type);
				break;

			case DICE_INPUT_MINUS:
			case DICE_INPUT_DIGIT:
			case DICE_INPUT_UPPER:
				/* Truncate tokens if they are too long to fit. */
				if (token_end < DICE_TOKEN_SIZE) {
					token[token_end] = string[current];
					token_end++;
				}

				state = dice_parse_state_transition(state, input_type);
				break;

			default:
				break;
		}

		/*
		 * Allow 'M' to be used as the bonus marker and to be used in variable
		 * names.
		 * Ideally, 'm' should be the only marker and this could go away by
		 * adding a case to the switch above for DICE_INPUT_BONUS
		 * (underneath DICE_INPUT_NULL).
		 */
		if (string[current] == 'M') {
			if (state == DICE_STATE_VAR || state == DICE_STATE_VAR_CHAR) {
				if (token_end < DICE_TOKEN_SIZE) {
					token[token_end] = string[current];
					token_end++;
				}

				state = dice_parse_state_transition(state, DICE_INPUT_UPPER);
			}
			else
				state = dice_parse_state_transition(state, DICE_INPUT_BONUS);
		}
		else if (string[current] == 'm') {
			state = dice_parse_state_transition(state, DICE_INPUT_BONUS);
		}

		/* Illegal transition. */
		if (state >= DICE_STATE_MAX)
			return false;

		/*
		 * Default flushing to true, since there are more states that don't
		 * need to be flushed. For some states, we need to do a bit of extra
		 * work, since the parser isn't that complex. A more complex parser
		 * would have more explicit states for variable names.
		 */
		flush = true;

		switch (state) {
			case DICE_STATE_FLUSH_BASE:
				last_seen = DICE_SEEN_BASE;
				break;

			case DICE_STATE_FLUSH_DICE:
				last_seen = DICE_SEEN_DICE;
				/* If we see a 'd' without a number before it, we assume it
				 * to be one die. */
				if (strlen(token) == 0) {
					token[0] = '1';
					token[1] = '\0';
				}
				break;

			case DICE_STATE_FLUSH_SIDE:
				last_seen = DICE_SEEN_SIDE;
				break;

			case DICE_STATE_FLUSH_BONUS:
				last_seen = DICE_SEEN_BONUS;
				break;

			case DICE_STATE_FLUSH_ALL:
				/* Flushing all means that we are flushing whatever comes after
				 * it was that we last saw. */
				if (last_seen < DICE_SEEN_BONUS)
					last_seen++;
				break;

			case DICE_STATE_BONUS:
				/* The bonus state is weird, so if we last saw dice, we're now
				 * seeing sides. */
				if (last_seen == DICE_SEEN_DICE)
					last_seen = DICE_SEEN_SIDE;
				else
					last_seen = DICE_SEEN_BONUS;
				break;

			default:
				/* We're in a state that shouldn't flush anything. */
				flush = false;
				break;
		}

		/*
		 * If we have a token that we need to flush, put it where it needs to
		 * go in the dice object. If the token is an uppercase letter, it's
		 * a variable and needs to go in the expression table. Otherwise, we
		 * try to parse it as a number, where it is set directly as a value.
		 */
		if (flush && strlen(token) > 0) {
			int value = 0;
			bool is_variable = false;

			if (isupper(token[0])) {
				value = dice_add_variable(dice, token);
				is_variable = true;
			}
			else {
				value = (int)strtol(token, NULL, 0);
				is_variable = false;
			}

			switch (last_seen) {
				case DICE_SEEN_BASE:
					dice->b = value;
					dice->ex_b = is_variable;
					break;
				case DICE_SEEN_DICE:
					dice->x = value;
					dice->ex_x = is_variable;
					break;
				case DICE_SEEN_SIDE:
					dice->y = value;
					dice->ex_y = is_variable;
					break;
				case DICE_SEEN_BONUS:
					dice->m = value;
					dice->ex_m = is_variable;
					break;
				default:
					break;
			}

			memset(token, 0, DICE_TOKEN_SIZE + 1);
			token_end = 0;
		}
	}

	return true;
}